

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter_inc.h
# Opt level: O0

size_t RemapBlockIdsDistance
                 (uint8_t *block_ids,size_t length,uint16_t *new_id,size_t num_histograms)

{
  ulong local_38;
  size_t i;
  uint16_t next_id;
  size_t num_histograms_local;
  uint16_t *new_id_local;
  size_t length_local;
  uint8_t *block_ids_local;
  
  i._6_2_ = 0;
  for (local_38 = 0; local_38 < num_histograms; local_38 = local_38 + 1) {
    new_id[local_38] = 0x100;
  }
  for (local_38 = 0; local_38 < length; local_38 = local_38 + 1) {
    if (new_id[block_ids[local_38]] == 0x100) {
      new_id[block_ids[local_38]] = i._6_2_;
      i._6_2_ = i._6_2_ + 1;
    }
  }
  for (local_38 = 0; local_38 < length; local_38 = local_38 + 1) {
    block_ids[local_38] = (uint8_t)new_id[block_ids[local_38]];
  }
  return (ulong)i._6_2_;
}

Assistant:

static size_t FN(RemapBlockIds)(uint8_t* block_ids, const size_t length,
                                uint16_t* new_id, const size_t num_histograms) {
  static const uint16_t kInvalidId = 256;
  uint16_t next_id = 0;
  size_t i;
  for (i = 0; i < num_histograms; ++i) {
    new_id[i] = kInvalidId;
  }
  for (i = 0; i < length; ++i) {
    BROTLI_DCHECK(block_ids[i] < num_histograms);
    if (new_id[block_ids[i]] == kInvalidId) {
      new_id[block_ids[i]] = next_id++;
    }
  }
  for (i = 0; i < length; ++i) {
    block_ids[i] = (uint8_t)new_id[block_ids[i]];
    BROTLI_DCHECK(block_ids[i] < num_histograms);
  }
  BROTLI_DCHECK(next_id <= num_histograms);
  return next_id;
}